

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O1

void __thiscall
de::BlockBuffer<unsigned_char>::BlockBuffer
          (BlockBuffer<unsigned_char> *this,int blockSize,int numBlocks)

{
  int iVar1;
  uchar *puVar2;
  int *piVar3;
  deSemaphore dVar4;
  ulong uVar5;
  
  this->m_writeBlock = 0;
  this->m_writePos = 0;
  this->m_readBlock = 0;
  this->m_readPos = 0;
  this->m_fill = 0;
  this->m_empty = 0;
  this->m_blockSize = blockSize;
  this->m_numBlocks = numBlocks;
  this->m_elements = (uchar *)0x0;
  this->m_numUsedInBlock = (int *)0x0;
  Mutex::Mutex(&this->m_writeLock,0);
  Mutex::Mutex(&this->m_readLock,0);
  this->m_canceled = 0;
  iVar1 = this->m_numBlocks;
  puVar2 = (uchar *)operator_new__((long)(this->m_blockSize * iVar1));
  this->m_elements = puVar2;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar5 = (long)iVar1 << 2;
  }
  piVar3 = (int *)operator_new__(uVar5);
  this->m_numUsedInBlock = piVar3;
  dVar4 = deSemaphore_create(0,(deSemaphoreAttributes *)0x0);
  this->m_fill = dVar4;
  dVar4 = deSemaphore_create(numBlocks,(deSemaphoreAttributes *)0x0);
  this->m_empty = dVar4;
  return;
}

Assistant:

BlockBuffer<T>::BlockBuffer (int blockSize, int numBlocks)
	: m_fill			(0)
	, m_empty			(0)
	, m_writeBlock		(0)
	, m_writePos		(0)
	, m_readBlock		(0)
	, m_readPos			(0)
	, m_blockSize		(blockSize)
	, m_numBlocks		(numBlocks)
	, m_elements		(DE_NULL)
	, m_numUsedInBlock	(DE_NULL)
	, m_writeLock		()
	, m_readLock		()
	, m_canceled		(DE_FALSE)
{
	DE_ASSERT(blockSize > 0);
	DE_ASSERT(numBlocks > 0);

	try
	{
		m_elements			= new T[m_numBlocks*m_blockSize];
		m_numUsedInBlock	= new int[m_numBlocks];
	}
	catch (...)
	{
		delete[] m_elements;
		delete[] m_numUsedInBlock;
		throw;
	}

	m_fill	= deSemaphore_create(0, DE_NULL);
	m_empty	= deSemaphore_create(numBlocks, DE_NULL);
	DE_ASSERT(m_fill && m_empty);
}